

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O0

size_t aspa_collapse_as_path(uint32_t *as_path,size_t len)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  uint32_t *local_38;
  size_t j;
  size_t i;
  size_t len_local;
  uint32_t *as_path_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (len == 0) {
    as_path_local = (uint32_t *)0x0;
  }
  else {
    j = 1;
    while( true ) {
      bVar3 = false;
      if (j < len) {
        bVar3 = as_path[j - 1] != as_path[j];
      }
      if (!bVar3) break;
      j = j + 1;
    }
    as_path_local = (uint32_t *)len;
    if (j != len) {
      local_38 = (uint32_t *)j;
      sVar2 = j;
      while( true ) {
        do {
          j = sVar2 + 1;
          bVar3 = false;
          if (j < len) {
            bVar3 = as_path[sVar2] == as_path[j];
          }
          sVar2 = j;
        } while (bVar3);
        if (j == len) break;
        as_path[(long)local_38] = as_path[j];
        local_38 = (uint32_t *)((long)local_38 + 1);
      }
      as_path_local = local_38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (size_t)as_path_local;
}

Assistant:

RTRLIB_EXPORT size_t aspa_collapse_as_path(uint32_t as_path[], size_t len)
{
	if (len == 0)
		return 0;

	size_t i = 1;

	while (i < len && as_path[i - 1] != as_path[i])
		i++;

	if (i == len)
		return len;

	size_t j = i;

	i++;

	while (true) { // equivalent to while (i < len)
		while (i < len && as_path[i - 1] == as_path[i])
			i++;

		if (i == len)
			break;

		as_path[j++] = as_path[i++];
	}

	return j;
}